

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread_futures.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  reference this;
  ostream *poVar4;
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  future<int> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> *__range1;
  undefined1 local_e8 [4];
  int count;
  uint local_c4 [3];
  undefined1 local_b8 [4];
  int n;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  type func;
  time_t t;
  signal<void_()> sig;
  
  sig.m_slots._108_4_ = 0;
  obs::signal<void_()>::signal((signal<void_()> *)&t,in_ESI,in_RDX);
  time((time_t *)0x0);
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&t;
  std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::vector
            ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)local_b8);
  local_c4[1] = 1;
  local_c4[0] = std::thread::hardware_concurrency();
  local_c4[0] = local_c4[0] >> 1;
  piVar3 = std::max<int>((int *)(local_c4 + 1),(int *)local_c4);
  local_c4[2] = *piVar3;
  while (local_c4[2] != 0) {
    local_c4[2] = local_c4[2] + -1;
    std::async<main::__0&>((launch)local_e8,(type *)0x1);
    std::vector<std::future<int>,std::allocator<std::future<int>>>::emplace_back<std::future<int>>
              ((vector<std::future<int>,std::allocator<std::future<int>>> *)local_b8,
               (future<int> *)local_e8);
    std::future<int>::~future((future<int> *)local_e8);
  }
  __range1._4_4_ = 0;
  local_c4[2] = local_c4[2] + -1;
  __end1 = std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::begin
                     ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)local_b8);
  f = (future<int> *)
      std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::end
                ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)local_b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::future<int>_*,_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>
                                *)&f);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<std::future<int>_*,_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>
           ::operator*(&__end1);
    iVar2 = std::future<int>::get(this);
    __range1._4_4_ = iVar2 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<std::future<int>_*,_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>
    ::operator++(&__end1);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Count = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,__range1._4_4_);
  iVar2 = 0x10d3a5;
  std::operator<<(poVar4,"\n");
  sig.m_slots._108_4_ = 0;
  std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector
            ((vector<std::future<int>,_std::allocator<std::future<int>_>_> *)local_b8);
  obs::signal<void_()>::~signal((signal<void_()> *)&t,iVar2,__handler);
  return sig.m_slots._108_4_;
}

Assistant:

int main() {
  obs::signal<void()> sig;
  std::time_t t = std::time(nullptr);

  auto func =
    [&sig, t](){
      int count = 0;
      while ((std::time(nullptr) - t) < 5) {
        std::vector<obs::scoped_connection> conns(32);
        for (auto& conn : conns) {
          conn = sig.connect([](){ });
          ++count;
          if (std::time(nullptr) - t >= 5)
            break;
        }
      }
      return count;
    };

  std::vector<std::future<int>> futures;
  int n = std::max<int>(1, std::thread::hardware_concurrency()/2);
  while (n--)
    futures.emplace_back(std::async(std::launch::async, func));

  int count = 0;
  for (auto& f : futures)
    count += f.get();

  std::cout << "Count = " << count << "\n";
  return 0;
}